

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall cmGeneratorTarget::TraceDependencies(cmGeneratorTarget *this)

{
  cmTargetTraceDependencies tracer;
  cmTargetTraceDependencies cStack_f8;
  
  if (this->Target->TargetTypeValue != GLOBAL_TARGET) {
    cmTargetTraceDependencies::cmTargetTraceDependencies(&cStack_f8,this);
    cmTargetTraceDependencies::Trace(&cStack_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cStack_f8.NewSources);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
    ::~_Rb_tree(&cStack_f8.NameMap._M_t);
    std::
    _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
    ::~_Rb_tree(&cStack_f8.SourcesQueued._M_t);
    std::_Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Deque_base
              ((_Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
               &cStack_f8.SourceQueue);
  }
  return;
}

Assistant:

cmStateEnums::TargetType cmGeneratorTarget::GetType() const
{
  return this->Target->GetType();
}